

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasAkzoNob_dns.c
# Opt level: O0

int main(void)

{
  int iVar1;
  undefined8 uVar2;
  void *mem_00;
  double dVar3;
  sunrealtype y05;
  sunrealtype y04;
  sunrealtype y03;
  sunrealtype y02;
  sunrealtype y01;
  SUNContext ctx;
  SUNLinearSolver LS;
  SUNMatrix A;
  int nout;
  sunrealtype incr;
  sunrealtype tout;
  sunrealtype time;
  N_Vector in_stack_00000068;
  int retval;
  N_Vector q;
  N_Vector rr;
  N_Vector yp;
  N_Vector yy;
  void *mem;
  UserData data;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  char *funcname;
  void *returnvalue;
  N_Vector y;
  sunrealtype t;
  void *mem_01;
  undefined8 local_78;
  int local_5c;
  double local_50;
  undefined1 local_48 [12];
  int local_3c;
  long *local_38;
  undefined8 local_30;
  undefined8 local_28;
  long *local_20;
  undefined8 local_18;
  undefined8 *local_10;
  int local_4;
  
  local_4 = 0;
  mem_01 = (void *)0x3fdc6a7ef9db22d1;
  t = 0.00123;
  y = (N_Vector)0x0;
  returnvalue = (void *)0x3f7cac083126e979;
  funcname = (char *)0x0;
  local_18 = 0;
  local_28 = 0;
  local_20 = (long *)0x0;
  local_3c = SUNContext_Create(0,&local_78);
  iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff5c);
  if (iVar1 == 0) {
    local_10 = (undefined8 *)malloc(0x48);
    *local_10 = 0x4032b33333333333;
    local_10[1] = 0x3fe28f5c28f5c28f;
    local_10[2] = 0x3fb70a3d70a3d70a;
    local_10[3] = 0x3fdae147ae147ae1;
    local_10[4] = 0x4041333333333333;
    local_10[5] = 0x400a666666666666;
    local_10[6] = 0x405cf51eb851eb85;
    local_10[7] = 0x3feccccccccccccd;
    local_10[8] = 0x4087080000000000;
    local_20 = (long *)N_VNew_Serial(6,local_78);
    iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff5c);
    if (iVar1 == 0) {
      local_28 = N_VClone(local_20);
      iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff5c);
      if (iVar1 == 0) {
        **(undefined8 **)(*local_20 + 0x10) = 0x3fdc6a7ef9db22d1;
        *(undefined8 *)(*(long *)(*local_20 + 0x10) + 8) = 0x3f5426fe718a86d7;
        *(undefined8 *)(*(long *)(*local_20 + 0x10) + 0x10) = 0;
        *(undefined8 *)(*(long *)(*local_20 + 0x10) + 0x18) = 0x3f7cac083126e979;
        *(undefined8 *)(*(long *)(*local_20 + 0x10) + 0x20) = 0;
        *(double *)(*(long *)(*local_20 + 0x10) + 0x28) = (double)local_10[6] * 0.444 * 0.007;
        N_VConst(0,local_28);
        local_30 = N_VClone(local_20);
        res((sunrealtype)q,in_stack_00000068,(N_Vector)time,(N_Vector)tout,(void *)incr);
        N_VScale(0xbff0000000000000,local_30,local_28);
        N_VDestroy(local_30);
        local_38 = (long *)N_VNew_Serial(1,local_78);
        iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff5c);
        if (iVar1 == 0) {
          **(undefined8 **)(*local_38 + 0x10) = 0;
          local_18 = IDACreate(local_78);
          iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff5c);
          if (iVar1 == 0) {
            local_3c = IDAInit(0,local_18,res,local_20,local_28);
            iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff5c);
            if (iVar1 == 0) {
              local_3c = IDASStolerances(0x3e45798ee2308c3a,0x3ddb7cdfd9d7bdbb,local_18);
              iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff5c);
              if (iVar1 == 0) {
                local_3c = IDASetUserData(local_18,local_10);
                iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff5c);
                if (iVar1 == 0) {
                  uVar2 = SUNDenseMatrix(6,6,local_78);
                  iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff5c);
                  if (iVar1 == 0) {
                    mem_00 = (void *)SUNLinSol_Dense(local_20,uVar2,local_78);
                    iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff5c);
                    if (iVar1 == 0) {
                      local_3c = IDASetLinearSolver(local_18,mem_00,uVar2);
                      iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff5c);
                      if (iVar1 == 0) {
                        local_3c = IDAQuadInit(local_18,rhsQ,local_38);
                        iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff5c);
                        if (iVar1 == 0) {
                          local_3c = IDAQuadSStolerances(0x3ddb7cdfd9d7bdbb,0x3d719799812dea11,
                                                         local_18);
                          iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff5c);
                          if (iVar1 == 0) {
                            local_3c = IDASetQuadErrCon(local_18,1);
                            iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff5c);
                            if (iVar1 == 0) {
                              PrintHeader((sunrealtype)funcname,
                                          (sunrealtype)
                                          CONCAT44(in_stack_ffffffffffffff5c,
                                                   in_stack_ffffffffffffff58),(N_Vector)0x1029fd);
                              PrintOutput(mem_01,t,y);
                              local_50 = 1e-08;
                              local_5c = 0;
                              dVar3 = pow(18000000000.0,0.04);
                              do {
                                local_3c = IDASolve(local_50,local_18,local_48,local_20,local_28,1);
                                iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff5c)
                                ;
                                if (iVar1 != 0) {
                                  return 1;
                                }
                                PrintOutput(mem_01,t,y);
                                local_5c = local_5c + 1;
                                local_50 = dVar3 * local_50;
                              } while (local_5c < 0x1a);
                              local_3c = IDAGetQuad(local_18,local_48,local_38);
                              iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff5c);
                              if (iVar1 == 0) {
                                printf(
                                      "\n--------------------------------------------------------\n"
                                      );
                                printf("G:          %24.16f \n",**(undefined8 **)(*local_38 + 0x10))
                                ;
                                printf(
                                      "--------------------------------------------------------\n\n"
                                      );
                                local_3c = PrintFinalStats(mem_00);
                                iVar1 = check_retval(returnvalue,funcname,in_stack_ffffffffffffff5c)
                                ;
                                if (iVar1 == 0) {
                                  IDAFree(&local_18);
                                  SUNLinSolFree(mem_00);
                                  SUNMatDestroy(uVar2);
                                  N_VDestroy(local_20);
                                  N_VDestroy(local_28);
                                  N_VDestroy(local_38);
                                  free(local_10);
                                  SUNContext_Free(&local_78);
                                  local_4 = 0;
                                }
                                else {
                                  local_4 = 1;
                                }
                              }
                              else {
                                local_4 = 1;
                              }
                            }
                            else {
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  UserData data;
  void* mem;
  N_Vector yy, yp, rr, q;
  int retval;
  sunrealtype time, tout, incr;
  int nout;
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNContext ctx;

  /* Consistent IC for  y, y'. */
  const sunrealtype y01 = SUN_RCONST(0.444);
  const sunrealtype y02 = SUN_RCONST(0.00123);
  const sunrealtype y03 = SUN_RCONST(0.0);
  const sunrealtype y04 = SUN_RCONST(0.007);
  const sunrealtype y05 = SUN_RCONST(0.0);

  mem = NULL;
  yy = yp = NULL;
  A       = NULL;
  LS      = NULL;

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Allocate user data. */
  data = (UserData)malloc(sizeof(*data));

  /* Fill user's data with the appropriate values for coefficients. */
  data->k1   = SUN_RCONST(18.7);
  data->k2   = SUN_RCONST(0.58);
  data->k3   = SUN_RCONST(0.09);
  data->k4   = SUN_RCONST(0.42);
  data->K    = SUN_RCONST(34.4);
  data->klA  = SUN_RCONST(3.3);
  data->Ks   = SUN_RCONST(115.83);
  data->pCO2 = SUN_RCONST(0.9);
  data->H    = SUN_RCONST(737.0);

  /* Allocate N-vectors. */
  yy = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)yy, "N_VNew_Serial", 0)) { return (1); }
  yp = N_VClone(yy);
  if (check_retval((void*)yp, "N_VNew_Serial", 0)) { return (1); }

  /* Set IC */
  Ith(yy, 1) = y01;
  Ith(yy, 2) = y02;
  Ith(yy, 3) = y03;
  Ith(yy, 4) = y04;
  Ith(yy, 5) = y05;
  Ith(yy, 6) = data->Ks * y01 * y04;

  /* Get y' = - res(t0, y, 0) */
  N_VConst(ZERO, yp);

  rr = N_VClone(yy);
  res(T0, yy, yp, rr, data);
  N_VScale(-ONE, rr, yp);
  N_VDestroy(rr);

  /* Create and initialize q0 for quadratures. */
  q = N_VNew_Serial(1, ctx);
  if (check_retval((void*)q, "N_VNew_Serial", 0)) { return (1); }
  Ith(q, 1) = ZERO;

  /* Call IDACreate and IDAInit to initialize IDA memory */
  mem = IDACreate(ctx);
  if (check_retval((void*)mem, "IDACreate", 0)) { return (1); }

  retval = IDAInit(mem, res, T0, yy, yp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  /* Set tolerances. */
  retval = IDASStolerances(mem, RTOL, ATOL);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* Attach user data. */
  retval = IDASetUserData(mem, data);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* Initialize QUADRATURE(S). */
  retval = IDAQuadInit(mem, rhsQ, q);
  if (check_retval(&retval, "IDAQuadInit", 1)) { return (1); }

  /* Set tolerances and error control for quadratures. */
  retval = IDAQuadSStolerances(mem, RTOLQ, ATOLQ);
  if (check_retval(&retval, "IDAQuadSStolerances", 1)) { return (1); }

  retval = IDASetQuadErrCon(mem, SUNTRUE);
  if (check_retval(&retval, "IDASetQuadErrCon", 1)) { return (1); }

  PrintHeader(RTOL, ATOL, yy);
  /* Print initial states */
  PrintOutput(mem, 0.0, yy);

  tout = T1;
  nout = 0;
  incr = SUNRpowerR(TF / T1, ONE / NF);

  /* FORWARD run. */
  while (1)
  {
    retval = IDASolve(mem, tout, &time, yy, yp, IDA_NORMAL);
    if (check_retval(&retval, "IDASolve", 1)) { return (1); }

    PrintOutput(mem, time, yy);

    nout++;
    tout *= incr;

    if (nout > NF) { break; }
  }

  retval = IDAGetQuad(mem, &time, q);
  if (check_retval(&retval, "IDAGetQuad", 1)) { return (1); }

  printf("\n--------------------------------------------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("G:          %24.16Lf \n", Ith(q, 1));
#else
  printf("G:          %24.16f \n", Ith(q, 1));
#endif
  printf("--------------------------------------------------------\n\n");

  retval = PrintFinalStats(mem);
  if (check_retval(&retval, "PrintFinalStats", 1)) { return (1); }

  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  N_VDestroy(yy);
  N_VDestroy(yp);
  N_VDestroy(q);
  free(data);
  SUNContext_Free(&ctx);

  return (0);
}